

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

bool __thiscall PhyloTree::equals(PhyloTree *this,PhyloTree *t)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_70;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  
  __first1 = (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  __last1 = (this->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __first2 = (t->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((long)__last1 - (long)__first1 !=
       (long)(t->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) ||
     (bVar1 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (__first1,__last1,__first2), !bVar1)) {
    return false;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_28,&this->leafEdgeLengths);
  std::vector<double,_std::allocator<double>_>::vector(&local_40,&t->leafEdgeLengths);
  bVar1 = Tools::vector_equal<double>(&local_28,&local_40);
  if (bVar1) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_58,&this->edges);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_70,&t->edges);
    bVar1 = Tools::vector_equal<PhyloTreeEdge>(&local_58,&local_70);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_58);
  }
  else {
    bVar1 = false;
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    return bVar1;
  }
  operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return bVar1;
}

Assistant:

bool PhyloTree::equals(const PhyloTree& t) {
    return (leaf2NumMap == t.leaf2NumMap) && Tools::vector_equal(leafEdgeLengths, t.leafEdgeLengths) && Tools::vector_equal(edges, t.edges);
}